

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O0

bool cfd::core::AdaptorUtil::Verify
               (AdaptorSignature *adaptor_sig,AdaptorProof *proof,Pubkey *adaptor,ByteData256 *msg,
               Pubkey *pubkey)

{
  int iVar1;
  secp256k1_context_struct *ctx_00;
  uchar *adaptor_sig65;
  uchar *msg32;
  uchar *adaptor_proof97;
  ByteData local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  ByteData local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  undefined1 local_b8 [8];
  secp256k1_pubkey secp_adaptor;
  secp256k1_pubkey secp_pubkey;
  secp256k1_context_struct *ctx;
  Pubkey *pubkey_local;
  ByteData256 *msg_local;
  Pubkey *adaptor_local;
  AdaptorProof *proof_local;
  AdaptorSignature *adaptor_sig_local;
  
  ctx_00 = wally_get_secp_context();
  ParsePubkey((secp256k1_pubkey *)(secp_adaptor.data + 0x38),pubkey);
  ParsePubkey((secp256k1_pubkey *)local_b8,adaptor);
  AdaptorSignature::GetData(&local_e8,adaptor_sig);
  ByteData::GetBytes(&local_d0,&local_e8);
  adaptor_sig65 =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0);
  ByteData256::GetBytes(&local_110,msg);
  msg32 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_110);
  AdaptorProof::GetData(&local_140,proof);
  ByteData::GetBytes(&local_128,&local_140);
  adaptor_proof97 =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  iVar1 = secp256k1_ecdsa_adaptor_sig_verify
                    (ctx_00,adaptor_sig65,(secp256k1_pubkey *)(secp_adaptor.data + 0x38),msg32,
                     (secp256k1_pubkey *)local_b8,adaptor_proof97);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  ByteData::~ByteData(&local_140);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_110);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0);
  ByteData::~ByteData(&local_e8);
  return iVar1 == 1;
}

Assistant:

bool AdaptorUtil::Verify(
    const AdaptorSignature &adaptor_sig, const AdaptorProof &proof,
    const Pubkey &adaptor, const ByteData256 &msg, const Pubkey &pubkey) {
  auto ctx = wally_get_secp_context();
  auto secp_pubkey = ParsePubkey(pubkey);
  auto secp_adaptor = ParsePubkey(adaptor);
  return secp256k1_ecdsa_adaptor_sig_verify(
             ctx, adaptor_sig.GetData().GetBytes().data(), &secp_pubkey,
             msg.GetBytes().data(), &secp_adaptor,
             proof.GetData().GetBytes().data()) == 1;
}